

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_uqadd_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong *puVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = desc * 8 & 0xff;
  uVar4 = uVar6 + 8;
  uVar2 = (ulong)uVar4;
  uVar7 = 0;
  bVar3 = false;
  do {
    uVar5 = *(ulong *)((long)vm + uVar7 * 8);
    puVar1 = (ulong *)((long)vn + uVar7 * 8);
    lVar8 = uVar5 + *puVar1;
    if (CARRY8(uVar5,*puVar1)) {
      bVar3 = true;
      lVar8 = -1;
    }
    *(long *)((long)vd + uVar7 * 8) = lVar8;
    uVar7 = uVar7 + 1;
  } while (uVar4 >> 3 != uVar7);
  if (bVar3) {
    *(undefined4 *)vq = 1;
  }
  uVar4 = desc >> 2 & 0xf8;
  if (uVar4 <= uVar6) {
    return;
  }
  uVar5 = (ulong)(uVar4 + 8);
  uVar7 = uVar2 + 8;
  if (uVar2 + 8 < uVar5) {
    uVar7 = uVar5;
  }
  memset((void *)((long)vd + uVar2),0,(~uVar2 + uVar7 & 0xfffffffffffffff8) + 8);
  return;
}

Assistant:

void HELPER(gvec_uqadd_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        uint64_t nn = n[i], mm = m[i], dd = nn + mm;
        if (dd < nn) {
            dd = UINT64_MAX;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}